

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double pearson_05_mean(double a,double b,double c)

{
  if (b <= 1.0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PEARSON_05_MEAN - Warning!\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  MEAN undefined for B <= 1.\n",0x1d);
  }
  else {
    c = c + a / (b + -1.0);
  }
  return c;
}

Assistant:

double pearson_05_mean ( double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    PEARSON_05_MEAN evaluates the mean of the Pearson 5 PDF.
//
//  Discussion:
//
//    The mean is undefined for B <= 1.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    0.0 < A, 0.0 < B.
//
//    Output, double PEARSON_05_MEAN, the mean of the PDF.
//
{
  double mean;

  if ( b <= 1.0 )
  {
    cout << " \n";
    cout << "PEARSON_05_MEAN - Warning!\n";
    cout << "  MEAN undefined for B <= 1.\n";
    mean = c;
    return mean;
  }

  mean = c + a / ( b - 1.0 );

  return mean;
}